

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterConversion.h
# Opt level: O2

void PixelToaster::convert_XRGB8888_to_XBGR1555(integer32 *source,integer16 *destination,uint count)

{
  uint uVar1;
  ulong uVar2;
  
  for (uVar2 = 0; count != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = source[uVar2];
    destination[uVar2] =
         (ushort)((uVar1 & 0xf8) << 7) |
         (ushort)(uVar1 >> 6) & 0x3e0 | (ushort)(uVar1 >> 0x13) & 0x1f;
  }
  return;
}

Assistant:

inline void convert_XRGB8888_to_XBGR1555(const integer32 source[], integer16 destination[], unsigned int count)
{
    for (unsigned int i = 0; i < count; ++i)
    {
        integer32 r = (source[i] & 0x00F80000) >> 19;
        integer32 g = (source[i] & 0x0000F800) >> 6;
        integer32 b = (source[i] & 0x000000F8) << 7;

        destination[i] = (integer16)(r | g | b);
    }
}